

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O3

void mp::WriteModelItem(MemoryWriter *wrt,QuadraticObjective *obj,ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  char *pcVar2;
  size_t __n;
  size_t sVar3;
  ulong uVar4;
  char *str_1;
  char *str;
  char *pcVar5;
  ptrdiff_t _Num;
  
  pcVar5 = "maximize ";
  if ((obj->super_NLObjective).super_LinearObjective.sense_ == MIN) {
    pcVar5 = "minimize ";
  }
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  uVar4 = sVar3 + 9;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    sVar3 = pBVar1->size_;
  }
  pcVar2 = pBVar1->ptr_;
  pcVar2[sVar3 + 8] = pcVar5[8];
  *(undefined8 *)(pcVar2 + sVar3) = *(undefined8 *)pcVar5;
  pBVar1->size_ = uVar4;
  pcVar5 = (obj->super_NLObjective).super_LinearObjective.name_._M_dataplus._M_p;
  __n = strlen(pcVar5);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + __n;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  if (__n != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar5,__n);
  }
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  uVar4 = sVar3 + 2;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    sVar3 = pBVar1->size_;
  }
  pcVar5 = pBVar1->ptr_;
  (pcVar5 + sVar3)[0] = ':';
  (pcVar5 + sVar3)[1] = ' ';
  pBVar1->size_ = uVar4;
  WriteModelItem(wrt,&(obj->super_NLObjective).super_LinearObjective.lt_,vnam);
  if ((obj->qt_).folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      != 0) {
    if ((obj->super_NLObjective).super_LinearObjective.lt_.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
      sVar3 = pBVar1->size_;
      uVar4 = sVar3 + 3;
      if (pBVar1->capacity_ < uVar4) {
        (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
        sVar3 = pBVar1->size_;
      }
      pcVar5 = pBVar1->ptr_;
      pcVar5[sVar3 + 2] = ' ';
      pcVar5 = pcVar5 + sVar3;
      pcVar5[0] = ' ';
      pcVar5[1] = '+';
      pBVar1->size_ = uVar4;
    }
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    sVar3 = pBVar1->size_;
    if (sVar3 == pBVar1->capacity_) {
      (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
      sVar3 = pBVar1->size_;
    }
    pBVar1->size_ = sVar3 + 1;
    pBVar1->ptr_[sVar3] = '(';
    WriteModelItem(wrt,&obj->qt_,vnam);
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    sVar3 = pBVar1->size_;
    if (sVar3 == pBVar1->capacity_) {
      (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
      sVar3 = pBVar1->size_;
    }
    pBVar1->size_ = sVar3 + 1;
    pBVar1->ptr_[sVar3] = ')';
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const QuadraticObjective& obj,
                    ItemNamer& vnam) {
  wrt << (obj.obj_sense() ? "maximize " : "minimize ");
  assert(obj.name() && *obj.name());
  wrt << obj.name() << ": ";
  WriteModelItem(wrt, obj.GetLinTerms(), vnam);
  if (obj.GetQPTerms().size()) {
    if (obj.GetLinTerms().size())
      wrt << " + ";
    wrt << '(';
    WriteModelItem(wrt, obj.GetQPTerms(), vnam);
    wrt << ')';
  }
}